

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::JitArenaAllocator>::Clear(BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  bool bVar1;
  BVIndex index;
  BVSparseNode *pBVar2;
  BVSparseNode *current;
  Type *prevNextField;
  BVSparse<Memory::JitArenaAllocator> *pBStack_10;
  BVIndex i_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  current = (BVSparseNode *)0x0;
  prevNextField._4_4_ = i;
  pBStack_10 = this;
  pBVar2 = NodeFromIndex(this,i,(Type **)&current,false);
  if (pBVar2 != (BVSparseNode *)0x0) {
    index = BVUnitT<unsigned_long>::Offset(prevNextField._4_4_);
    BVUnitT<unsigned_long>::Clear(&pBVar2->data,index);
    bVar1 = BVUnitT<unsigned_long>::IsEmpty(&pBVar2->data);
    if (bVar1) {
      pBVar2 = DeleteNode(this,pBVar2,false);
      current->next = pBVar2;
    }
  }
  return;
}

Assistant:

void
BVSparse<TAllocator>::Clear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if(current)
    {
        current->data.Clear(SparseBVUnit::Offset(i));
        if (current->data.IsEmpty())
        {
            *prevNextField = this->DeleteNode(current, false);
        }
    }
}